

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O0

lzma_ret lz_encoder_update(void *coder_ptr,lzma_allocator *allocator,lzma_filter *filters_null,
                          lzma_filter *reversed_filters)

{
  lzma_ret ret_;
  lzma_coder_conflict *coder;
  lzma_filter *reversed_filters_local;
  lzma_filter *filters_null_local;
  lzma_allocator *allocator_local;
  void *coder_ptr_local;
  
  if (*(long *)((long)coder_ptr + 0x18) == 0) {
    coder_ptr_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    coder_ptr_local._4_4_ = (**(code **)((long)coder_ptr + 0x18))(*coder_ptr,reversed_filters);
    if (coder_ptr_local._4_4_ == LZMA_OK) {
      coder_ptr_local._4_4_ =
           lzma_next_filter_update
                     ((lzma_next_coder *)((long)coder_ptr + 0x98),allocator,reversed_filters + 1);
    }
  }
  return coder_ptr_local._4_4_;
}

Assistant:

static lzma_ret
lz_encoder_update(void *coder_ptr, const lzma_allocator *allocator,
		const lzma_filter *filters_null lzma_attribute((__unused__)),
		const lzma_filter *reversed_filters)
{
	lzma_coder *coder = coder_ptr;

	if (coder->lz.options_update == NULL)
		return LZMA_PROG_ERROR;

	return_if_error(coder->lz.options_update(
			coder->lz.coder, reversed_filters));

	return lzma_next_filter_update(
			&coder->next, allocator, reversed_filters + 1);
}